

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_prov_cipher.c
# Opt level: O0

int cipher_update(void *vgctx,uchar *out,size_t *outl,size_t outsize,uchar *in,size_t inl)

{
  int iVar1;
  long *in_RDX;
  uchar *in_RSI;
  long in_RDI;
  uchar *in_R8;
  int in_R9D;
  int res;
  int int_outl;
  GOST_CTX *gctx;
  int local_48;
  int local_3c [9];
  long *local_18;
  
  if (in_RDX == (long *)0x0) {
    local_48 = 0;
  }
  else {
    local_48 = (int)*in_RDX;
  }
  local_3c[0] = local_48;
  local_18 = in_RDX;
  iVar1 = EVP_CipherUpdate(*(EVP_CIPHER_CTX **)(in_RDI + 0x20),in_RSI,local_3c,in_R8,in_R9D);
  if ((0 < iVar1) && (local_18 != (long *)0x0)) {
    *local_18 = (long)local_3c[0];
  }
  return (int)(0 < iVar1);
}

Assistant:

static int cipher_update(void *vgctx,
                         unsigned char *out, size_t *outl, size_t outsize,
                         const unsigned char *in, size_t inl)
{
    GOST_CTX *gctx = vgctx;
    int int_outl = outl != NULL ? *outl : 0;
    int res = EVP_CipherUpdate(gctx->cctx, out, &int_outl, in, (int)inl);

    if (res > 0 && outl != NULL)
        *outl = (size_t)int_outl;
    return res > 0;
}